

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::free
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,void *__ptr)

{
  long lVar1;
  KeyVal *pKVar2;
  long lVar3;
  
  pKVar2 = this->_a;
  lVar3 = (long)*(int *)((long)&pKVar2[-1].key.field_2 + 8);
  if (lVar3 != 0) {
    lVar1 = 0;
    do {
      if (*(int *)((long)&(pKVar2->key)._size + lVar1) != 0) {
        ::free(*(void **)((long)&(pKVar2->key).field_2 + lVar1));
      }
      lVar1 = lVar1 + 0x20;
    } while (lVar3 * 0x20 != lVar1);
    pKVar2 = this->_a;
  }
  ::free((void *)((long)&pKVar2[-1].key.field_2 + 8));
  this->_a = (KeyVal *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}